

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase92::run(TestCase92 *this)

{
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  Builder builder_04;
  Builder builder_05;
  Reader brand;
  undefined1 auVar1 [40];
  Builder builder_06;
  Builder builder_07;
  Reader reader;
  Reader reader_00;
  undefined2 uVar2;
  StructSchema SVar3;
  short sVar4;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StructSchema testListsSchema;
  SchemaLoader loader;
  char *local_890;
  Builder root;
  Builder root_1;
  Builder local_690;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  Reader local_4b0;
  Reader local_478;
  DebugComparison<int,_short> _kjCondition_3;
  undefined1 local_418;
  MallocMessageBuilder builder;
  Builder root_4;
  
  SchemaLoader::SchemaLoader(&loader);
  _kjCondition_3.left = 0x655118;
  _kjCondition_3.right = 0;
  _kjCondition_3._6_2_ = 0;
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&_kjCondition_3);
  root_1.schema.super_Schema = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  SVar3 = Schema::asStruct((Schema *)&root_1);
  root_1.schema.super_Schema.raw = (Schema)((long)schemas::s_9c8e9318b29d9cd3 + 0x48);
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&root_1);
  SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root,&builder.super_MessageBuilder,SVar3);
  builder_04.builder.capTable = root.builder.capTable;
  builder_04.schema.super_Schema.raw = root.schema.super_Schema.raw;
  builder_04.builder.segment = root.builder.segment;
  builder_04.builder.data = root.builder.data;
  builder_04.builder.pointers = root.builder.pointers;
  builder_04.builder.dataSize = root.builder.dataSize;
  builder_04.builder.pointerCount = root.builder.pointerCount;
  builder_04.builder._38_2_ = root.builder._38_2_;
  initDynamicTestMessage(builder_04);
  DynamicStruct::Builder::asReader(&local_478,&root);
  reader.reader.segment = local_478.reader.segment;
  reader.schema.super_Schema.raw = local_478.schema.super_Schema.raw;
  reader.reader.capTable = local_478.reader.capTable;
  reader.reader.data = local_478.reader.data;
  reader.reader.pointers = local_478.reader.pointers;
  reader.reader.dataSize = local_478.reader.dataSize;
  reader.reader.pointerCount = local_478.reader.pointerCount;
  reader.reader._38_2_ = local_478.reader._38_2_;
  reader.reader.nestingLimit = local_478.reader.nestingLimit;
  reader.reader._44_4_ = local_478.reader._44_4_;
  checkDynamicTestMessage(reader);
  Schema::requireUsableAs<capnproto_test::capnp::test::TestAllTypes>((Schema *)&root);
  _kjCondition_3._0_8_ = _kjCondition_3._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&root_1,(Maybe<kj::Exception> *)&_kjCondition_3);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition,(DebugExpression<kj::Maybe<kj::Exception>> *)&root_1,(None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&root_1);
  kj::_::NullableValue<kj::Exception>::~NullableValue
            ((NullableValue<kj::Exception> *)&_kjCondition_3);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[93],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x6c,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.as<TestAllTypes>(); }) != kj::none\", _kjCondition"
               ,(char (*) [93])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.as<TestAllTypes>(); }) != kj::none"
               ,&_kjCondition);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_690,&builder.super_MessageBuilder);
  builder_00._builder.capTable = local_690._builder.capTable;
  builder_00._builder.segment = local_690._builder.segment;
  builder_00._builder.data = local_690._builder.data;
  builder_00._builder.pointers = local_690._builder.pointers;
  builder_00._builder.dataSize = local_690._builder.dataSize;
  builder_00._builder.pointerCount = local_690._builder.pointerCount;
  builder_00._builder._38_2_ = local_690._builder._38_2_;
  checkTestMessage(builder_00);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestAllTypes>(&loader);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&_kjCondition,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root_1,(MessageBuilder *)&_kjCondition,SVar3);
  builder_05.builder.pointers._4_4_ = root_1.builder.pointers._4_4_;
  builder_05.builder.pointers._0_4_ = (uint)root_1.builder.pointers;
  builder_05.builder.segment = root_1.builder.segment;
  builder_05.schema = (StructSchema)(StructSchema)root_1.schema.super_Schema.raw;
  builder_05.builder.capTable = root_1.builder.capTable;
  builder_05.builder.data = root_1.builder.data;
  builder_05.builder.dataSize = root_1.builder.dataSize;
  builder_05.builder.pointerCount = root_1.builder.pointerCount;
  builder_05.builder._38_2_ = root_1.builder._38_2_;
  initDynamicTestMessage(builder_05);
  Schema::requireUsableAs<capnproto_test::capnp::test::TestAllTypes>((Schema *)&root_1);
  builder_01._builder.pointers._4_4_ = root_1.builder.pointers._4_4_;
  builder_01._builder.pointers._0_4_ = (uint)root_1.builder.pointers;
  builder_01._builder.capTable = root_1.builder.capTable;
  builder_01._builder.segment = root_1.builder.segment;
  builder_01._builder.data = root_1.builder.data;
  builder_01._builder.dataSize = root_1.builder.dataSize;
  builder_01._builder.pointerCount = root_1.builder.pointerCount;
  builder_01._builder._38_2_ = root_1.builder._38_2_;
  checkTestMessage(builder_01);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&_kjCondition);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestListDefaults>
            (&loader);
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  _kjCondition.left.ptr._0_8_ = SchemaLoader::get(&loader,0xa851ad32cbc2ffea,brand,(Schema)0x669c88)
  ;
  testListsSchema = Schema::asStruct((Schema *)&_kjCondition);
  _kjCondition.left.ptr.field_1.value.ownFile.content.ptr = schemas::s_a851ad32cbc2ffea + 0x48;
  _kjCondition.left.ptr.field_1.value.ownFile.content.size_ = (size_t)anon_var_dwarf_43885;
  _kjCondition.left.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)&DAT_00000005;
  _kjCondition.left.ptr.field_1._24_1_ =
       testListsSchema.super_Schema.raw != (RawBrandedSchema *)(schemas::s_a851ad32cbc2ffea + 0x48);
  _kjCondition.left.ptr._0_8_ = (SegmentBuilder *)&testListsSchema;
  if ((!(bool)_kjCondition.left.ptr.field_1._24_1_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[69],kj::_::DebugComparison<capnp::StructSchema&,capnp::StructSchema>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x83,ERROR,
               "\"failed: expected \" \"testListsSchema != Schema::from<TestListDefaults>()\", _kjCondition"
               ,(char (*) [69])
                "failed: expected testListsSchema != Schema::from<TestListDefaults>()",
               (DebugComparison<capnp::StructSchema_&,_capnp::StructSchema> *)&_kjCondition);
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&_kjCondition,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root_1,(MessageBuilder *)&_kjCondition,testListsSchema);
  builder_06.builder.pointers._4_4_ = root_1.builder.pointers._4_4_;
  builder_06.builder.pointers._0_4_ = (uint)root_1.builder.pointers;
  builder_06.builder.segment = root_1.builder.segment;
  builder_06.schema = (StructSchema)(StructSchema)root_1.schema.super_Schema.raw;
  builder_06.builder.capTable = root_1.builder.capTable;
  builder_06.builder.data = root_1.builder.data;
  builder_06.builder.dataSize = root_1.builder.dataSize;
  builder_06.builder.pointerCount = root_1.builder.pointerCount;
  builder_06.builder._38_2_ = root_1.builder._38_2_;
  initDynamicTestLists(builder_06);
  DynamicStruct::Builder::asReader(&local_4b0,&root_1);
  reader_00.reader.segment = local_4b0.reader.segment;
  reader_00.schema.super_Schema.raw = local_4b0.schema.super_Schema.raw;
  reader_00.reader.capTable = local_4b0.reader.capTable;
  reader_00.reader.data = local_4b0.reader.data;
  reader_00.reader.pointers = local_4b0.reader.pointers;
  reader_00.reader.dataSize = local_4b0.reader.dataSize;
  reader_00.reader.pointerCount = local_4b0.reader.pointerCount;
  reader_00.reader._38_2_ = local_4b0.reader._38_2_;
  reader_00.reader.nestingLimit = local_4b0.reader.nestingLimit;
  reader_00.reader._44_4_ = local_4b0.reader._44_4_;
  checkDynamicTestLists(reader_00);
  Schema::requireUsableAs<capnproto_test::capnp::test::TestListDefaults>((Schema *)&root_1);
  builder_02._builder.pointers._4_4_ = root_1.builder.pointers._4_4_;
  builder_02._builder.pointers._0_4_ = (uint)root_1.builder.pointers;
  builder_02._builder.capTable = root_1.builder.capTable;
  builder_02._builder.segment = root_1.builder.segment;
  builder_02._builder.data = root_1.builder.data;
  builder_02._builder.dataSize = root_1.builder.dataSize;
  builder_02._builder.pointerCount = root_1.builder.pointerCount;
  builder_02._builder._38_2_ = root_1.builder._38_2_;
  checkTestMessage(builder_02);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&_kjCondition);
  _kjCondition_3.left = 0x6569c0;
  _kjCondition_3.right = 0;
  _kjCondition_3._6_2_ = 0;
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&_kjCondition_3);
  root_1.schema.super_Schema = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  root_1.builder.capTable = (CapTableBuilder *)anon_var_dwarf_3d166;
  root_1.builder.data = &DAT_00000005;
  root_1.builder.pointers._0_1_ = root_1.schema.super_Schema.raw == testListsSchema.super_Schema.raw
  ;
  root_1.builder.segment = (SegmentBuilder *)&testListsSchema;
  if ((root_1.schema.super_Schema.raw != testListsSchema.super_Schema.raw) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[93],kj::_::DebugComparison<capnp::Schema,capnp::StructSchema&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x8f,ERROR,
               "\"failed: expected \" \"loader.load(Schema::from<TestListDefaults>().getProto()) == testListsSchema\", _kjCondition"
               ,(char (*) [93])
                "failed: expected loader.load(Schema::from<TestListDefaults>().getProto()) == testListsSchema"
               ,(DebugComparison<capnp::Schema,_capnp::StructSchema_&> *)&root_1);
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&_kjCondition,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root_1,(MessageBuilder *)&_kjCondition,testListsSchema);
  builder_07.builder.pointers._4_4_ = root_1.builder.pointers._4_4_;
  builder_07.builder.pointers._0_4_ = (uint)root_1.builder.pointers;
  builder_07.builder.segment = root_1.builder.segment;
  builder_07.schema = (StructSchema)(StructSchema)root_1.schema.super_Schema.raw;
  builder_07.builder.capTable = root_1.builder.capTable;
  builder_07.builder.data = root_1.builder.data;
  builder_07.builder.dataSize = root_1.builder.dataSize;
  builder_07.builder.pointerCount = root_1.builder.pointerCount;
  builder_07.builder._38_2_ = root_1.builder._38_2_;
  initDynamicTestLists(builder_07);
  Schema::requireUsableAs<capnproto_test::capnp::test::TestListDefaults>((Schema *)&root_1);
  builder_03._builder.pointers._4_4_ = root_1.builder.pointers._4_4_;
  builder_03._builder.pointers._0_4_ = (uint)root_1.builder.pointers;
  builder_03._builder.capTable = root_1.builder.capTable;
  builder_03._builder.segment = root_1.builder.segment;
  builder_03._builder.data = root_1.builder.data;
  builder_03._builder.dataSize = root_1.builder.dataSize;
  builder_03._builder.pointerCount = root_1.builder.pointerCount;
  builder_03._builder._38_2_ = root_1.builder._38_2_;
  checkTestMessage(builder_03);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&_kjCondition);
  _kjCondition_3.left = 0x6553c8;
  _kjCondition_3.right = 0;
  _kjCondition_3._6_2_ = 0;
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&_kjCondition_3);
  root_1.schema.super_Schema = SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  SVar3 = Schema::asStruct((Schema *)&root_1);
  root_1.schema.super_Schema.raw = (Schema)((long)schemas::s_fc76a82eecb7a718 + 0x48);
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&root_1);
  SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  root_1.schema.super_Schema.raw = (Schema)((long)schemas::s_ee0a6b99b7dc7ab2 + 0x48);
  Schema::getProto((Reader *)&_kjCondition,(Schema *)&root_1);
  SchemaLoader::load(&loader,(Reader *)&_kjCondition);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&_kjCondition,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root_4,(MessageBuilder *)&_kjCondition,SVar3);
  name.content.size_ = 7;
  name.content.ptr = "union0";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_3,&root_4,name);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&builder,(Builder *)&_kjCondition_3);
  root_1.schema.super_Schema.raw._0_4_ = 3;
  root_1.builder.segment = (SegmentBuilder *)0x7b;
  name_01.content.size_ = 8;
  name_01.content.ptr = "u0f1s16";
  DynamicStruct::Builder::set((Builder *)&builder,name_01,(Reader *)&root_1);
  DynamicValue::Reader::~Reader((Reader *)&root_1);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_3);
  name_00.content.size_ = 7;
  name_00.content.ptr = "union1";
  DynamicStruct::Builder::get((Builder *)&_kjCondition_3,&root_4,name_00);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)&builder,(Builder *)&_kjCondition_3);
  root_1.schema.super_Schema.raw._0_4_ = 6;
  root_1.builder.segment = (SegmentBuilder *)anon_var_dwarf_44334;
  root_1.builder.capTable = (CapTableBuilder *)0x6;
  name_02.content.size_ = 7;
  name_02.content.ptr = "u1f0sp";
  DynamicStruct::Builder::set((Builder *)&builder,name_02,(Reader *)&root_1);
  DynamicValue::Reader::~Reader((Reader *)&root_1);
  DynamicValue::Builder::~Builder((Builder *)&_kjCondition_3);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestUnion>
            ((Builder *)&_kjCondition_3,(MessageBuilder *)&_kjCondition);
  StructBuilder::asReader((StructBuilder *)&_kjCondition_3);
  if ((uint)root_1.builder.pointers < 0x50) {
    sVar4 = 0;
  }
  else {
    sVar4 = *(short *)&root_1.builder.capTable[1].super_CapTableReader._vptr_CapTableReader;
  }
  _kjCondition_3.right = sVar4;
  _kjCondition_3.left = 0x7b;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  _kjCondition_3.result = sVar4 == 0x7b;
  if ((!_kjCondition_3.result) && (kj::_::Debug::minSeverity < 3)) {
    builder.super_MessageBuilder._vptr_MessageBuilder =
         (_func_int **)CONCAT44(builder.super_MessageBuilder._vptr_MessageBuilder._4_4_,0x7b);
    if ((uint)root_1.builder.pointers < 0x50) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(undefined2 *)&root_1.builder.capTable[1].super_CapTableReader._vptr_CapTableReader;
    }
    root.schema.super_Schema.raw._0_2_ = uVar2;
    kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xa5,ERROR,
               "\"failed: expected \" \"(123) == (reader.getUnion0().getU0f1s16())\", _kjCondition, 123, reader.getUnion0().getU0f1s16()"
               ,(char (*) [60])"failed: expected (123) == (reader.getUnion0().getU0f1s16())",
               &_kjCondition_3,(int *)&builder,(short *)&root);
  }
  local_890 = "hello";
  builder.super_MessageBuilder.arenaSpace[3] =
       (void *)CONCAT44(root_1.builder.pointers._4_4_,(uint)root_1.builder.pointers);
  builder.super_MessageBuilder.arenaSpace[4] = (void *)root_1.builder._32_8_;
  builder.super_MessageBuilder.arenaSpace[1] = root_1.builder.capTable;
  builder.super_MessageBuilder.arenaSpace[2] = root_1.builder.data;
  builder.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)root_1.schema.super_Schema.raw;
  builder.super_MessageBuilder.arenaSpace[0] = root_1.builder.segment;
  root._0_16_ = capnproto_test::capnp::test::TestUnion::Union1::Reader::getU1f0sp
                          ((Reader *)&builder);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition_3,
             (DebugExpression<char_const(&)[6]> *)&local_890,(Reader *)&root);
  if ((local_418 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    builder.super_MessageBuilder.arenaSpace[3] =
         (void *)CONCAT44(root_1.builder.pointers._4_4_,(uint)root_1.builder.pointers);
    builder.super_MessageBuilder.arenaSpace[4] = (void *)root_1.builder._32_8_;
    builder.super_MessageBuilder.arenaSpace[1] = root_1.builder.capTable;
    builder.super_MessageBuilder.arenaSpace[2] = root_1.builder.data;
    builder.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)root_1.schema.super_Schema.raw
    ;
    builder.super_MessageBuilder.arenaSpace[0] = root_1.builder.segment;
    root._0_16_ = capnproto_test::capnp::test::TestUnion::Union1::Reader::getU1f0sp
                            ((Reader *)&builder);
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Reader>&,char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xa6,ERROR,
               "\"failed: expected \" \"(\\\"hello\\\") == (reader.getUnion1().getU1f0sp())\", _kjCondition, \"hello\", reader.getUnion1().getU1f0sp()"
               ,(char (*) [63])"failed: expected (\"hello\") == (reader.getUnion1().getU1f0sp())",
               (DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition_3,
               (char (*) [6])"hello",(Reader *)&root);
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&_kjCondition);
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, Use) {
  SchemaLoader loader;

  StructSchema schema = loader.load(Schema::from<TestAllTypes>().getProto()).asStruct();

  // Also have to load TestEnum.
  loader.load(Schema::from<TestEnum>().getProto());

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(schema);

    initDynamicTestMessage(root);
    checkDynamicTestMessage(root.asReader());

    // Can't convert to TestAllTypes because we didn't use loadCompiledTypeAndDependencies().
    EXPECT_ANY_THROW(root.as<TestAllTypes>());

    // But if we reinterpret the raw bytes, it works.
    checkTestMessage(builder.getRoot<TestAllTypes>());
  }

  loader.loadCompiledTypeAndDependencies<TestAllTypes>();

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(schema);

    initDynamicTestMessage(root);

    // Now we can actually cast.
    checkTestMessage(root.as<TestAllTypes>());
  }

  // Let's also test TestListDefaults, but as we do so, let's load the compiled types first, to
  // make sure the opposite order works.

  loader.loadCompiledTypeAndDependencies<TestListDefaults>();
  StructSchema testListsSchema = loader.get(typeId<TestListDefaults>()).asStruct();
  EXPECT_TRUE(testListsSchema != Schema::from<TestListDefaults>());

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(testListsSchema);

    initDynamicTestLists(root);
    checkDynamicTestLists(root.asReader());

    checkTestMessage(root.as<TestListDefaults>());
  }

  EXPECT_TRUE(loader.load(Schema::from<TestListDefaults>().getProto()) == testListsSchema);

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(testListsSchema);

    initDynamicTestLists(root);
    checkTestMessage(root.as<TestListDefaults>());
  }

  // Finally, let's test some unions.
  StructSchema unionSchema = loader.load(Schema::from<TestUnion>().getProto()).asStruct();
  loader.load(Schema::from<TestUnion::Union0>().getProto());
  loader.load(Schema::from<TestUnion::Union1>().getProto());
  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(unionSchema);

    root.get("union0").as<DynamicStruct>().set("u0f1s16", 123);
    root.get("union1").as<DynamicStruct>().set("u1f0sp", "hello");

    auto reader = builder.getRoot<TestUnion>().asReader();
    EXPECT_EQ(123, reader.getUnion0().getU0f1s16());
    EXPECT_EQ("hello", reader.getUnion1().getU1f0sp());
  }
}